

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Decode
          (Point_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Point_Object_State_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x58) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Object_State_Header::Decode(&this->super_Object_State_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Object_State_Header).field_0x4b);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ObjTyp).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_Loc).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_Apperance);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ReqID).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_RecvID).super_DataTypeBase);
  KDataStream::operator>>(pKVar2,&this->m_ui32Padding1);
  return;
}

Assistant:

void Point_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < POINT_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjTyp
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_Apperance
           >> m_ui16Padding
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID
           >> m_ui32Padding1;
}